

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::guess_value_type_abi_cxx11_
          (result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  char cVar1;
  
  cVar1 = **(char **)(this + 0x40);
  if (cVar1 == '{') {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value = table;
    return __return_storage_ptr__;
  }
  if (cVar1 == '\'') {
LAB_00129aa4:
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value = string;
  }
  else {
    if (cVar1 == '[') {
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value = array;
      return __return_storage_ptr__;
    }
    if (cVar1 != 'f') {
      if ((cVar1 == 'i') || (cVar1 == 'n')) {
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ.value = floating;
        return __return_storage_ptr__;
      }
      if (cVar1 != 't') {
        if (cVar1 != '\"') {
          guess_number_type_abi_cxx11_(__return_storage_ptr__,this,loc);
          return __return_storage_ptr__;
        }
        goto LAB_00129aa4;
      }
    }
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value = boolean;
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<value_t, std::string> guess_value_type(const location& loc)
{
    switch(*loc.iter())
    {
        case '"' : {return ok(value_t::string);  }
        case '\'': {return ok(value_t::string);  }
        case 't' : {return ok(value_t::boolean); }
        case 'f' : {return ok(value_t::boolean); }
        case '[' : {return ok(value_t::array);   }
        case '{' : {return ok(value_t::table);   }
        case 'i' : {return ok(value_t::floating);} // inf.
        case 'n' : {return ok(value_t::floating);} // nan.
        default  : {return guess_number_type(loc);}
    }
}